

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O2

int64_t TPZChangeEl::NearestNode(TPZGeoMesh *gmesh,TPZVec<double> *x,double tol)

{
  TPZGeoNode *this;
  ostream *poVar1;
  int c;
  long lVar2;
  long lVar3;
  int64_t n;
  long nelem;
  double dVar4;
  double dVar5;
  TPZVec<double> nodeCoord;
  
  TPZVec<double>::TPZVec(&nodeCoord,3);
  lVar3 = (gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  nelem = 0;
  if (lVar3 < 1) {
    lVar3 = nelem;
  }
  do {
    if (nelem == lVar3) {
LAB_00f296d4:
      std::operator<<((ostream *)&std::cout,"Node not found for coordinates ( ");
      poVar1 = std::ostream::_M_insert<double>(*x->fStore);
      std::operator<<(poVar1," , ");
      poVar1 = std::ostream::_M_insert<double>(x->fStore[1]);
      std::operator<<(poVar1," , ");
      poVar1 = std::ostream::_M_insert<double>(x->fStore[2]);
      poVar1 = std::operator<<(poVar1," )");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"See ");
      poVar1 = std::operator<<(poVar1,
                               "static int64_t TPZChangeEl::NearestNode(TPZGeoMesh *, TPZVec<REAL> &, double)"
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzchangeel.cpp"
                 ,0x206);
    }
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
    TPZGeoNode::GetCoordinates(this,&nodeCoord);
    dVar4 = 0.0;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar5 = x->fStore[lVar2] - nodeCoord.fStore[lVar2];
      dVar4 = dVar4 + dVar5 * dVar5;
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    if (dVar4 <= tol) {
      if ((int)nelem != -1) {
        TPZVec<double>::~TPZVec(&nodeCoord);
        return (long)(int)nelem;
      }
      goto LAB_00f296d4;
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

int64_t TPZChangeEl::NearestNode(TPZGeoMesh * gmesh, TPZVec<REAL> &x, double tol)
{
	int meshNode = -1;
	
	TPZVec<REAL> nodeCoord(3);
	int64_t nnodes = gmesh->NNodes();
	
	for(int64_t n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gmesh->NodeVec()[n].GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = n;
			break;
		}
	}
	
	if(meshNode == -1)
	{
		std::cout << "Node not found for coordinates ( " << x[0] << " , " << x[1] << " , " << x[2] << " )" << std::endl;
		std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
		
		DebugStop();
	}
	
	return meshNode;
}